

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

Vector<unsigned_int,_4> __thiscall
gl4cts::Math::notEqual<4>(Math *this,Vector<double,_4> *left,Vector<double,_4> *right)

{
  bool bVar1;
  Vector<unsigned_int,_4> *result;
  int i;
  long lVar2;
  Vector<unsigned_int,_4> VVar3;
  Vector<bool,_4> res;
  
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  res.m_data[3] = false;
  lVar2 = 0;
  do {
    res.m_data[lVar2] = left->m_data[lVar2] != right->m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar2 = 0;
  do {
    bVar1 = res.m_data[lVar2];
    *(uint *)(this + lVar2 * 4) = (uint)bVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  VVar3.m_data[2]._0_1_ = bVar1;
  VVar3.m_data._0_8_ = this;
  VVar3.m_data._9_7_ = 0;
  return (Vector<unsigned_int,_4>)VVar3.m_data;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> notEqual(const tcu::Vector<glw::GLdouble, Size>& left,
											   const tcu::Vector<glw::GLdouble, Size>& right)
{
	return convertBvecToUvec(tcu::notEqual(left, right));
}